

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerStats.cpp
# Opt level: O1

ostream * operator<<(ostream *out,LayerStats *stats)

{
  ostream *poVar1;
  char local_30 [8];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{\n",2);
  local_30[0] = '\t';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"SynapseStats: ",0xe);
  poVar1 = operator<<(poVar1,&stats->synapseWeight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[1] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"NeuronMPThresh: ",0x10);
  poVar1 = operator<<(poVar1,&stats->neuronMPMax);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[2] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"NeuronMP: ",10);
  poVar1 = operator<<(poVar1,&stats->neuronMP);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[3] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"InducedPotential: ",0x12);
  poVar1 = operator<<(poVar1,&stats->neuronMPInduced);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[4] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 4,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"InducedSpikes: ",0xf);
  poVar1 = operator<<(poVar1,&stats->inducedSpikes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[5] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"SpikesStats: ",0xd);
  poVar1 = operator<<(poVar1,&stats->spikes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[6] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 6,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"GradVStats: ",0xc);
  poVar1 = operator<<(poVar1,&stats->gradV);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  local_30[7] = 9;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_30 + 7,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"GradWStats: ",0xc);
  poVar1 = operator<<(poVar1,&stats->gradW);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"}\n",2);
  return out;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const LayerStats &stats )
{
    char shift = '\t';
    out << "{\n";
    out << shift << "SynapseStats: " << stats.synapseWeight << "\n";
    out << shift << "NeuronMPThresh: " << stats.neuronMPMax << "\n";
    out << shift << "NeuronMP: " << stats.neuronMP << "\n";
    out << shift << "InducedPotential: " << stats.neuronMPInduced << "\n";
    out << shift << "InducedSpikes: " << stats.inducedSpikes << "\n";
    out << shift << "SpikesStats: " << stats.spikes << "\n";
    out << shift << "GradVStats: " << stats.gradV << "\n";
    out << shift << "GradWStats: " << stats.gradW << "\n";
    out << "}\n";
    return out;
}